

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_CfdCreateSighash_Test::TestBody(cfdcapi_transaction_CfdCreateSighash_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  char *str_buffer;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *sighash;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  undefined1 in_stack_00000837;
  int in_stack_00000838;
  uint32_t in_stack_0000083c;
  char *in_stack_00000840;
  char *in_stack_00000848;
  int in_stack_00000854;
  void *in_stack_00000858;
  char *in_stack_00000870;
  char *in_stack_00000878;
  int64_t in_stack_00000880;
  int in_stack_00000888;
  char **in_stack_00000898;
  bool *in_stack_fffffffffffffdc8;
  AssertionResult *in_stack_fffffffffffffdd0;
  int *rhs;
  CfdErrorCode *in_stack_fffffffffffffdd8;
  CfdErrorCode *lhs;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdec;
  void *in_stack_fffffffffffffe08;
  AssertionResult *pAVar5;
  char **in_stack_fffffffffffffe60;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  char *local_f0;
  AssertHelper local_e8;
  Message local_e0;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffdd8,(int *)in_stack_fffffffffffffdd0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c4aba);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2e0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3c4b1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4b72);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(type *)0x3c4ba6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2e1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3c4ca2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4d1d);
  local_a0 = (char *)0x0;
  rhs = (int *)0x8971a8;
  uVar4 = 0;
  uVar3 = 1;
  lhs = (CfdErrorCode *)0x23c34600;
  local_14 = CfdCreateSighash(in_stack_00000858,in_stack_00000854,in_stack_00000848,
                              in_stack_00000840,in_stack_0000083c,in_stack_00000838,
                              in_stack_00000870,in_stack_00000878,in_stack_00000880,
                              in_stack_00000888,(bool)in_stack_00000837,in_stack_00000898);
  local_b4 = 0;
  pAVar5 = &local_b0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar4),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar3),lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    in_stack_fffffffffffffe60 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3c4e40);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2e8,(char *)in_stack_fffffffffffffe60);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x3c4ea3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c4ef8);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_d8,
               "\"c37af31116d1b27caf68aae9e3ac82f1477929014d5b917657d0eb49478cb670\"","sighash",
               "c37af31116d1b27caf68aae9e3ac82f1477929014d5b917657d0eb49478cb670",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c4fa7);
      testing::internal::AssertHelper::AssertHelper
                (&local_e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2ea,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_e8);
      testing::Message::~Message((Message *)0x3c500a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c505f);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffffe08);
  if (local_14 != 0) {
    local_f0 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(pAVar5,in_stack_fffffffffffffe60);
    local_104 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar4),
               (char *)CONCAT44(in_stack_fffffffffffffde4,uVar3),lhs,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c5159);
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2f2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      testing::Message::~Message((Message *)0x3c51b6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c520b);
    testing::internal::CmpHelperSTREQ((internal *)&local_128,"\"\"","str_buffer","",local_f0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c52a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2f3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3c52fd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c5352);
    CfdFreeStringBuffer((char *)lhs);
    local_f0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(lhs);
  local_14c = 0;
  pAVar5 = &local_148;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffdec,uVar4),
             (char *)CONCAT44(in_stack_fffffffffffffde4,uVar3),lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3c5422);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2f9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x3c547f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c54d4);
  return;
}

Assistant:

TEST(cfdcapi_transaction, CfdCreateSighash) {
  static const char* tx_hex = "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a0100000000ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac11000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* sighash = nullptr;
  ret = CfdCreateSighash(
      handle, kCfdNetworkMainnet, tx_hex, "8ac60eb9575db5b2d987e29f301b5b819ea83a5c6579d282d189cc04b8e151ef",
      1, kCfdP2wpkh, "025476c2e83188368da1ff3e292e7acafcdb3566bb0ad253f62fc70f07aeee6357", "",
      600000000, kCfdSigHashAll, false, &sighash);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("c37af31116d1b27caf68aae9e3ac82f1477929014d5b917657d0eb49478cb670", sighash);
    CfdFreeStringBuffer(sighash);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}